

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCompoundCollisionAlgorithm.cpp
# Opt level: O0

void __thiscall
btCompoundLeafCallback::ProcessChildShape
          (btCompoundLeafCallback *this,btCollisionShape *childShape,int index)

{
  btCollisionObjectWrapper *parent;
  long *plVar1;
  bool bVar2;
  btCollisionShape *aabbMin1_00;
  btTransform *pbVar3;
  btCollisionShape *pbVar4;
  ulong uVar5;
  btCollisionObject *pbVar6;
  undefined8 uVar7;
  btCollisionObject *pbVar8;
  int in_EDX;
  btCollisionShape *in_RSI;
  btVector3 *in_RDI;
  btCollisionObjectWrapper *tmpWrap;
  btCollisionObjectWrapper compoundWrap;
  btVector3 aabbMax1;
  btVector3 aabbMin1;
  btVector3 aabbMax0;
  btVector3 aabbMin0;
  btTransform newChildWorldTrans;
  btTransform *childTrans;
  btTransform orgTrans;
  btCompoundShape *compoundShape;
  undefined4 in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  btCompoundShape *in_stack_fffffffffffffeb0;
  btVector3 *in_stack_fffffffffffffec8;
  btVector3 *in_stack_fffffffffffffed0;
  btCollisionObjectWrapper *local_118;
  undefined1 local_110 [16];
  btCollisionObject *in_stack_ffffffffffffff00;
  btTransform *in_stack_ffffffffffffff08;
  btVector3 local_e8;
  btVector3 local_d8;
  btVector3 local_c8;
  btVector3 local_b8;
  btTransform local_a8;
  btTransform *local_68;
  btCollisionShape *local_20;
  int local_14;
  btCollisionShape *local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_20 = btCollisionObjectWrapper::getCollisionShape
                       (*(btCollisionObjectWrapper **)(in_RDI->m_floats + 2));
  btCollisionObjectWrapper::getWorldTransform(*(btCollisionObjectWrapper **)(in_RDI->m_floats + 2));
  btTransform::btTransform
            ((btTransform *)in_stack_fffffffffffffeb0,
             (btTransform *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  local_68 = btCompoundShape::getChildTransform(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac)
  ;
  btTransform::operator*(in_stack_ffffffffffffff08,(btTransform *)in_stack_ffffffffffffff00);
  btVector3::btVector3(&local_b8);
  btVector3::btVector3(&local_c8);
  btVector3::btVector3(&local_d8);
  btVector3::btVector3(&local_e8);
  (*local_10->_vptr_btCollisionShape[2])(local_10,&local_a8,&local_b8,&local_c8);
  aabbMin1_00 = btCollisionObjectWrapper::getCollisionShape
                          (*(btCollisionObjectWrapper **)in_RDI[1].m_floats);
  pbVar3 = btCollisionObjectWrapper::getWorldTransform
                     (*(btCollisionObjectWrapper **)in_RDI[1].m_floats);
  (*aabbMin1_00->_vptr_btCollisionShape[2])(aabbMin1_00,pbVar3,&local_d8,&local_e8);
  if (gCompoundChildShapePairCallback != (btShapePairCallback)0x0) {
    in_stack_fffffffffffffed0 = (btVector3 *)gCompoundChildShapePairCallback;
    pbVar4 = btCollisionObjectWrapper::getCollisionShape
                       (*(btCollisionObjectWrapper **)in_RDI[1].m_floats);
    uVar5 = (*(code *)in_stack_fffffffffffffed0)(pbVar4,local_10);
    if ((uVar5 & 1) == 0) {
      return;
    }
  }
  bVar2 = TestAabbAgainstAabb2
                    ((btVector3 *)aabbMin1_00,in_RDI,in_stack_fffffffffffffed0,
                     in_stack_fffffffffffffec8);
  if (bVar2) {
    parent = *(btCollisionObjectWrapper **)(in_RDI->m_floats + 2);
    pbVar6 = btCollisionObjectWrapper::getCollisionObject
                       (*(btCollisionObjectWrapper **)(in_RDI->m_floats + 2));
    btCollisionObjectWrapper::btCollisionObjectWrapper
              ((btCollisionObjectWrapper *)local_110,parent,local_10,pbVar6,&local_a8,-1,local_14);
    if (*(long *)(*(long *)in_RDI[3].m_floats + (long)local_14 * 8) == 0) {
      uVar7 = (**(code **)(**(long **)(in_RDI[1].m_floats + 2) + 0x10))
                        (*(long **)(in_RDI[1].m_floats + 2),local_110,
                         *(undefined8 *)in_RDI[1].m_floats,*(undefined8 *)(in_RDI[3].m_floats + 2));
      *(undefined8 *)(*(long *)in_RDI[3].m_floats + (long)local_14 * 8) = uVar7;
    }
    pbVar6 = btManifoldResult::getBody0Internal((btManifoldResult *)0x18fcbe);
    pbVar8 = btCollisionObjectWrapper::getCollisionObject
                       (*(btCollisionObjectWrapper **)(in_RDI->m_floats + 2));
    if (pbVar6 == pbVar8) {
      local_118 = btManifoldResult::getBody0Wrap(*(btManifoldResult **)(in_RDI[2].m_floats + 2));
      btManifoldResult::setBody0Wrap
                (*(btManifoldResult **)(in_RDI[2].m_floats + 2),
                 (btCollisionObjectWrapper *)local_110);
      (**(code **)(**(long **)(in_RDI[2].m_floats + 2) + 0x10))
                (*(long **)(in_RDI[2].m_floats + 2),0xffffffff,local_14);
    }
    else {
      local_118 = btManifoldResult::getBody1Wrap(*(btManifoldResult **)(in_RDI[2].m_floats + 2));
      btManifoldResult::setBody1Wrap
                (*(btManifoldResult **)(in_RDI[2].m_floats + 2),
                 (btCollisionObjectWrapper *)local_110);
      (**(code **)(**(long **)(in_RDI[2].m_floats + 2) + 0x18))
                (*(long **)(in_RDI[2].m_floats + 2),0xffffffff,local_14);
    }
    plVar1 = *(long **)(*(long *)in_RDI[3].m_floats + (long)local_14 * 8);
    (**(code **)(*plVar1 + 0x10))
              (plVar1,local_110,*(undefined8 *)in_RDI[1].m_floats,*(undefined8 *)in_RDI[2].m_floats,
               *(undefined8 *)(in_RDI[2].m_floats + 2));
    pbVar6 = btManifoldResult::getBody0Internal((btManifoldResult *)0x18fda5);
    pbVar8 = btCollisionObjectWrapper::getCollisionObject
                       (*(btCollisionObjectWrapper **)(in_RDI->m_floats + 2));
    if (pbVar6 == pbVar8) {
      btManifoldResult::setBody0Wrap(*(btManifoldResult **)(in_RDI[2].m_floats + 2),local_118);
    }
    else {
      btManifoldResult::setBody1Wrap(*(btManifoldResult **)(in_RDI[2].m_floats + 2),local_118);
    }
  }
  return;
}

Assistant:

void	ProcessChildShape(const btCollisionShape* childShape,int index)
	{
		btAssert(index>=0);
		const btCompoundShape* compoundShape = static_cast<const btCompoundShape*>(m_compoundColObjWrap->getCollisionShape());
		btAssert(index<compoundShape->getNumChildShapes());


		//backup
		btTransform	orgTrans = m_compoundColObjWrap->getWorldTransform();
		
		const btTransform& childTrans = compoundShape->getChildTransform(index);
		btTransform	newChildWorldTrans = orgTrans*childTrans ;

		//perform an AABB check first
		btVector3 aabbMin0,aabbMax0,aabbMin1,aabbMax1;
		childShape->getAabb(newChildWorldTrans,aabbMin0,aabbMax0);
		m_otherObjWrap->getCollisionShape()->getAabb(m_otherObjWrap->getWorldTransform(),aabbMin1,aabbMax1);

		if (gCompoundChildShapePairCallback)
		{
			if (!gCompoundChildShapePairCallback(m_otherObjWrap->getCollisionShape(), childShape))
				return;
		}

		if (TestAabbAgainstAabb2(aabbMin0,aabbMax0,aabbMin1,aabbMax1))
		{

			btCollisionObjectWrapper compoundWrap(this->m_compoundColObjWrap,childShape,m_compoundColObjWrap->getCollisionObject(),newChildWorldTrans,-1,index);


			//the contactpoint is still projected back using the original inverted worldtrans
			if (!m_childCollisionAlgorithms[index])
				m_childCollisionAlgorithms[index] = m_dispatcher->findAlgorithm(&compoundWrap,m_otherObjWrap,m_sharedManifold);

			
			const btCollisionObjectWrapper* tmpWrap = 0;

			///detect swapping case
			if (m_resultOut->getBody0Internal() == m_compoundColObjWrap->getCollisionObject())
			{
				tmpWrap = m_resultOut->getBody0Wrap();
				m_resultOut->setBody0Wrap(&compoundWrap);
				m_resultOut->setShapeIdentifiersA(-1,index);
			} else
			{
				tmpWrap = m_resultOut->getBody1Wrap();
				m_resultOut->setBody1Wrap(&compoundWrap);
				m_resultOut->setShapeIdentifiersB(-1,index);
			}


			m_childCollisionAlgorithms[index]->processCollision(&compoundWrap,m_otherObjWrap,m_dispatchInfo,m_resultOut);

#if 0
			if (m_dispatchInfo.m_debugDraw && (m_dispatchInfo.m_debugDraw->getDebugMode() & btIDebugDraw::DBG_DrawAabb))
			{
				btVector3 worldAabbMin,worldAabbMax;
				m_dispatchInfo.m_debugDraw->drawAabb(aabbMin0,aabbMax0,btVector3(1,1,1));
				m_dispatchInfo.m_debugDraw->drawAabb(aabbMin1,aabbMax1,btVector3(1,1,1));
			}
#endif

			if (m_resultOut->getBody0Internal() == m_compoundColObjWrap->getCollisionObject())
			{
				m_resultOut->setBody0Wrap(tmpWrap);
			} else
			{
				m_resultOut->setBody1Wrap(tmpWrap);
			}
			
		}
	}